

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::UpdateLayout(ElementDocument *this)

{
  Element *pEVar1;
  Box *this_00;
  Vector2f containing_block;
  
  if (this->layout_dirty == true) {
    pEVar1 = Element::GetParentNode(&this->super_Element);
    if (pEVar1 == (Element *)0x0) {
      containing_block.x = 0.0;
      containing_block.y = 0.0;
    }
    else {
      pEVar1 = Element::GetParentNode(&this->super_Element);
      this_00 = Element::GetBox(pEVar1);
      containing_block = Box::GetSize(this_00);
    }
    LayoutEngine::FormatElement(&this->super_Element,containing_block);
    this->layout_dirty = false;
  }
  return;
}

Assistant:

void ElementDocument::UpdateLayout()
{
	// Note: Carefully consider when to call this function for performance reasons.
	// Ideally, only called once per update loop.
	if (layout_dirty)
	{
		RMLUI_ZoneScoped;
		RMLUI_ZoneText(source_url.c_str(), source_url.size());

		Vector2f containing_block(0, 0);
		if (GetParentNode() != nullptr)
			containing_block = GetParentNode()->GetBox().GetSize();

		LayoutEngine::FormatElement(this, containing_block);

		// Ignore dirtied layout during document formatting. Layouting must not require re-iteration.
		// In particular, scrollbars being enabled may set the dirty flag, but this case is already handled within the layout engine.
		layout_dirty = false;
	}
}